

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O2

void __thiscall WalkerManager::UpdateAllWalkers(WalkerManager *this)

{
  __shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  for (p_Var1 = &((this->walkers).
                  super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>;
      p_Var1 != &((this->walkers).
                  super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>; p_Var1 = p_Var1 + 1) {
    std::__shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,p_Var1);
    UpdateRandSpeed((shared_ptr<MWakler> *)&local_40,4.0,4.0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,p_Var1);
    RandWalk((shared_ptr<MWakler> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  return;
}

Assistant:

void UpdateAllWalkers()
    {
        for(auto iter=walkers.begin(); iter != walkers.end(); ++iter)
        {
            UpdateRandSpeed(*iter);
            RandWalk(*iter);
        }
    }